

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_flip_closed(roaring64_bitmap_t *r1,uint64_t min,uint64_t max)

{
  uint8_t uVar1;
  _Bool _Var2;
  int iVar3;
  roaring64_bitmap_t *prVar4;
  container_t *pcVar5;
  leaf_t lVar6;
  ulong uVar7;
  art_val_t *paVar8;
  uint32_t range_start;
  uint uVar9;
  uint range_end;
  long lVar10;
  uint8_t typecode2_1;
  uint8_t typecode2;
  undefined3 uStack_f7;
  ushort local_f4;
  uint64_t local_f0;
  uint64_t local_e8;
  uint8_t max_high48_key [6];
  uint8_t min_high48_key [6];
  art_iterator_t local_c0;
  
  if (max < min) {
    prVar4 = roaring64_bitmap_copy(r1);
    return prVar4;
  }
  min_high48_key._0_4_ =
       (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
       (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
  min_high48_key._4_2_ = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
  max_high48_key._0_4_ =
       (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
       (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
  max_high48_key._4_2_ = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
  local_f0 = max;
  local_e8 = min;
  prVar4 = roaring64_bitmap_create();
  art_init_iterator(&local_c0,&r1->art,true);
  while (paVar8 = local_c0.value, local_c0.value != (ulong *)0x0) {
    iVar3 = art_compare_keys(local_c0.key,min_high48_key);
    if (-1 < iVar3) break;
    _typecode2 = CONCAT31(uStack_f7,(char)*paVar8);
    pcVar5 = get_copy_of_container(r1->containers[*paVar8 >> 8],&typecode2,false);
    lVar6 = add_container(prVar4,pcVar5,typecode2);
    art_insert(&prVar4->art,local_c0.key,lVar6);
    art_iterator_next(&local_c0);
  }
  uVar9 = (uint)local_e8;
  local_e8 = CONCAT44(local_e8._4_4_,((uint)local_f0 & 0xffff) + 1);
  local_f0 = (min >> 0x10) - (max >> 0x10);
  for (lVar10 = 0; uVar7 = (min >> 0x10) + lVar10, uVar7 <= max >> 0x10; lVar10 = lVar10 + 1) {
    _typecode2 = ((uint)(uVar7 >> 0x20) & 0xff00) >> 8 | (uint)(uVar7 >> 0x18) & 0xff00 |
                 (uint)(uVar7 >> 8) & 0xff0000 | (uint)(((uVar7 & 0xff0000) << 0x18) >> 0x10);
    local_f4 = (ushort)(uVar7 >> 8) & 0xff | (ushort)((uVar7 << 0x38) >> 0x30);
    range_start = 0;
    if (lVar10 == 0) {
      range_start = uVar9 & 0xffff;
    }
    range_end = 0x10000;
    if (local_f0 + lVar10 == 0) {
      range_end = (uint)local_e8;
    }
    paVar8 = art_find(&r1->art,&typecode2);
    if (paVar8 == (art_val_t *)0x0) {
      pcVar5 = container_range_of_ones(range_start,range_end,&typecode2_1);
    }
    else {
      uVar1 = (uint8_t)*paVar8;
      if ((range_start == 0) && (0xffff < range_end)) {
        pcVar5 = container_not(r1->containers[*paVar8 >> 8],uVar1,&typecode2_1);
      }
      else {
        pcVar5 = container_not_range(r1->containers[*paVar8 >> 8],uVar1,range_start,range_end,
                                     &typecode2_1);
      }
    }
    uVar1 = typecode2_1;
    _Var2 = container_nonzero_cardinality(pcVar5,typecode2_1);
    if (_Var2) {
      lVar6 = add_container(prVar4,pcVar5,uVar1);
      art_insert(&prVar4->art,&typecode2,lVar6);
    }
    else {
      container_free(pcVar5,uVar1);
    }
  }
  art_upper_bound(&local_c0,&r1->art,max_high48_key);
  while (local_c0.value != (ulong *)0x0) {
    _typecode2 = CONCAT31(uStack_f7,(char)*local_c0.value);
    pcVar5 = get_copy_of_container(r1->containers[*local_c0.value >> 8],&typecode2,false);
    lVar6 = add_container(prVar4,pcVar5,typecode2);
    art_insert(&prVar4->art,local_c0.key,lVar6);
    art_iterator_next(&local_c0);
  }
  return prVar4;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_flip_closed(const roaring64_bitmap_t *r1,
                                                 uint64_t min, uint64_t max) {
    if (min > max) {
        return roaring64_bitmap_copy(r1);
    }
    uint8_t min_high48_key[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48_key);
    uint8_t max_high48_key[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48_key);
    uint64_t min_high48_bits = (min & 0xFFFFFFFFFFFF0000ULL) >> 16;
    uint64_t max_high48_bits = (max & 0xFFFFFFFFFFFF0000ULL) >> 16;

    roaring64_bitmap_t *r2 = roaring64_bitmap_create();
    art_iterator_t it = art_init_iterator((art_t *)&r1->art, /*first=*/true);

    // Copy the containers before min unchanged.
    while (it.value != NULL && compare_high48(it.key, min_high48_key) < 0) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    // Flip the range (including non-existent containers!) between min and
    // max.
    for (uint64_t high48_bits = min_high48_bits; high48_bits <= max_high48_bits;
         high48_bits++) {
        uint8_t current_high48_key[ART_KEY_BYTES];
        split_key(high48_bits << 16, current_high48_key);

        uint32_t min_container = 0;
        if (high48_bits == min_high48_bits) {
            min_container = min_low16;
        }
        uint32_t max_container = 0xFFFF + 1;  // Exclusive range.
        if (high48_bits == max_high48_bits) {
            max_container = max_low16 + 1;  // Exclusive.
        }

        roaring64_flip_leaf(r1, r2, current_high48_key, min_container,
                            max_container);
    }

    // Copy the containers after max unchanged.
    it = art_upper_bound((art_t *)&r1->art, max_high48_key);
    while (it.value != NULL) {
        leaf_t leaf1 = (leaf_t)*it.value;
        uint8_t typecode2 = get_typecode(leaf1);
        container_t *container2 = get_copy_of_container(
            get_container(r1, leaf1), &typecode2, /*copy_on_write=*/false);
        leaf_t leaf2 = add_container(r2, container2, typecode2);
        art_insert(&r2->art, it.key, (art_val_t)leaf2);
        art_iterator_next(&it);
    }

    return r2;
}